

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

void __thiscall
CRenderTools::RenderQuads
          (CRenderTools *this,CQuad *pQuads,int NumQuads,int RenderFlags,ENVELOPE_EVAL pfnEval,
          void *pUser)

{
  bool bVar1;
  bool bVar2;
  anon_union_4_2_94730284_for_vector2_base<float>_1 *paVar3;
  IGraphics *pIVar4;
  int in_EDX;
  long in_RSI;
  CRenderTools *in_RDI;
  code *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  CPoint *pPoints;
  float Rot;
  float OffsetY;
  float OffsetX;
  int k_1;
  bool RepeatV;
  bool RepeatU;
  int k;
  float a;
  float b;
  float g;
  float r;
  CQuad *q;
  int i;
  float Conv;
  CFreeformItem Freeform;
  CColorVertex Array [4];
  float aChannels_1 [4];
  vec2 aTexCoords [4];
  float aChannels [4];
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  anon_union_4_2_94730284_for_vector2_base<float>_1 *local_130;
  CPoint *local_120;
  float local_118;
  float local_114;
  float local_110;
  int local_10c;
  int local_104;
  float local_100;
  float local_fc;
  float local_f8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_f4;
  int local_e8;
  CFreeformItem local_b8;
  CColorVertex local_98;
  CColorVertex CStack_84;
  CColorVertex CStack_70;
  CColorVertex CStack_5c;
  float local_48;
  float local_44;
  float local_40;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_38;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 local_34 [4];
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar4 = Graphics(in_RDI);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x17])();
  for (local_e8 = 0; local_e8 < in_EDX; local_e8 = local_e8 + 1) {
    local_120 = (CPoint *)(in_RSI + (long)local_e8 * 0x98);
    local_f4.x = 1.0;
    local_f8 = 1.0;
    local_fc = 1.0;
    local_100 = 1.0;
    if (-1 < local_120[0x12].x) {
      (*in_R8)((float)local_120[0x12].y / 1000.0,local_120[0x12].x,&local_18,in_R9);
      local_f4 = local_18;
      local_f8 = local_14;
      local_fc = local_10;
      local_100 = local_c;
    }
    paVar3 = &local_38;
    do {
      local_130 = paVar3;
      vector2_base<float>::vector2_base((vector2_base<float> *)local_130);
      paVar3 = local_130 + 2;
    } while (local_130 + 2 != &local_18);
    for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
      fVar5 = fx2f(local_120[(long)local_104 + 0xd].x);
      local_34[(long)local_104 * 2 + -1].y = fVar5;
      fVar5 = fx2f(local_120[(long)local_104 + 0xd].y);
      local_34[(long)local_104 * 2].y = fVar5;
    }
    bVar1 = false;
    bVar2 = false;
    for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
      if ((local_34[(long)local_10c * 2 + -1].y <= 0.0 &&
           local_34[(long)local_10c * 2 + -1].y != 0.0) ||
         (1.0 < local_34[(long)local_10c * 2 + -1].y)) {
        bVar1 = true;
      }
      if ((local_34[(long)local_10c * 2].y <= 0.0 && local_34[(long)local_10c * 2].y != 0.0) ||
         (1.0 < local_34[(long)local_10c * 2].y)) {
        bVar2 = true;
      }
    }
    pIVar4 = Graphics(in_RDI);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0xc])(pIVar4,(ulong)!bVar1,(ulong)!bVar2);
    pIVar4 = Graphics(in_RDI);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1b])
              (local_38.x,local_34[0].y,local_34[1],local_34[2],local_34[3],local_24,local_20,
               local_1c);
    local_110 = 0.0;
    local_114 = 0.0;
    local_118 = 0.0;
    if (-1 < local_120[0x11].x) {
      (*in_R8)((float)local_120[0x11].y / 1000.0,local_120[0x11].x,&local_48,in_R9);
      local_110 = local_48;
      local_114 = local_44;
      local_118 = (local_40 / 360.0) * 3.1415927 * 2.0;
    }
    IGraphics::CColorVertex::CColorVertex
              (&local_98,0,
               (float)local_120[5].x * 0.003921569 * local_f4.x * (float)local_120[6].y *
               0.003921569 * local_100,
               (float)local_120[5].y * 0.003921569 * local_f8 * (float)local_120[6].y * 0.003921569
               * local_100,
               (float)local_120[6].x * 0.003921569 * local_fc * (float)local_120[6].y * 0.003921569
               * local_100,(float)local_120[6].y * 0.003921569 * local_100);
    IGraphics::CColorVertex::CColorVertex
              (&CStack_84,1,
               (float)local_120[7].x * 0.003921569 * local_f4.x * (float)local_120[8].y *
               0.003921569 * local_100,
               (float)local_120[7].y * 0.003921569 * local_f8 * (float)local_120[8].y * 0.003921569
               * local_100,
               (float)local_120[8].x * 0.003921569 * local_fc * (float)local_120[8].y * 0.003921569
               * local_100,(float)local_120[8].y * 0.003921569 * local_100);
    IGraphics::CColorVertex::CColorVertex
              (&CStack_70,2,
               (float)local_120[9].x * 0.003921569 * local_f4.x * (float)local_120[10].y *
               0.003921569 * local_100,
               (float)local_120[9].y * 0.003921569 * local_f8 * (float)local_120[10].y * 0.003921569
               * local_100,
               (float)local_120[10].x * 0.003921569 * local_fc * (float)local_120[10].y *
               0.003921569 * local_100,(float)local_120[10].y * 0.003921569 * local_100);
    IGraphics::CColorVertex::CColorVertex
              (&CStack_5c,3,
               (float)local_120[0xb].x * 0.003921569 * local_f4.x * (float)local_120[0xc].y *
               0.003921569 * local_100,
               (float)local_120[0xb].y * 0.003921569 * local_f8 * (float)local_120[0xc].y *
               0.003921569 * local_100,
               (float)local_120[0xc].x * 0.003921569 * local_fc * (float)local_120[0xc].y *
               0.003921569 * local_100,(float)local_120[0xc].y * 0.003921569 * local_100);
    pIVar4 = Graphics(in_RDI);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x20])(pIVar4,&local_98,4);
    if ((local_118 != 0.0) || (NAN(local_118))) {
      RenderQuads::aRotated[0] = *local_120;
      RenderQuads::aRotated[1] = local_120[1];
      RenderQuads::aRotated[2] = local_120[2];
      RenderQuads::aRotated[3] = local_120[3];
      local_120 = RenderQuads::aRotated;
      Rotate((CPoint *)local_130,
             (CPoint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb4);
      Rotate((CPoint *)local_130,
             (CPoint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb4);
      Rotate((CPoint *)local_130,
             (CPoint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb4);
      Rotate((CPoint *)local_130,
             (CPoint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb4);
    }
    in_stack_fffffffffffffebc = fx2f(local_120->x);
    in_stack_fffffffffffffebc = in_stack_fffffffffffffebc + local_110;
    fVar5 = fx2f(local_120->y);
    fVar6 = fx2f(local_120[1].x);
    fVar7 = fx2f(local_120[1].y);
    fVar8 = fx2f(local_120[2].x);
    in_stack_fffffffffffffeb4 = fx2f(local_120[2].y);
    in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb4 + local_114;
    in_stack_fffffffffffffeb8 = fx2f(local_120[3].x);
    in_stack_fffffffffffffeb8 = in_stack_fffffffffffffeb8 + local_110;
    fVar9 = fx2f(local_120[3].y);
    IGraphics::CFreeformItem::CFreeformItem
              (&local_b8,in_stack_fffffffffffffebc,fVar5 + local_114,fVar6 + local_110,
               fVar7 + local_114,fVar8 + local_110,in_stack_fffffffffffffeb4,
               in_stack_fffffffffffffeb8,fVar9 + local_114);
    pIVar4 = Graphics(in_RDI);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1e])(pIVar4,&local_b8,1);
  }
  pIVar4 = Graphics(in_RDI);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x18])();
  pIVar4 = Graphics(in_RDI);
  (*(pIVar4->super_IInterface)._vptr_IInterface[10])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderQuads(const CQuad *pQuads, int NumQuads, int RenderFlags, ENVELOPE_EVAL pfnEval, void *pUser)
{
	Graphics()->QuadsBegin();
	float Conv = 1/255.0f;
	for(int i = 0; i < NumQuads; i++)
	{
		const CQuad *q = &pQuads[i];

		float r=1, g=1, b=1, a=1;

		if(q->m_ColorEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_ColorEnvOffset/1000.0f, q->m_ColorEnv, aChannels, pUser);
			r = aChannels[0];
			g = aChannels[1];
			b = aChannels[2];
			a = aChannels[3];
		}

		/*bool Opaque = false;
		 TODO: Analyze quadtexture
		if(a < 0.01f || (q->m_aColors[0].a < 0.01f && q->m_aColors[1].a < 0.01f && q->m_aColors[2].a < 0.01f && q->m_aColors[3].a < 0.01f))
			Opaque = true;

		if(Opaque && !(RenderFlags&LAYERRENDERFLAG_OPAQUE))
			continue;
		if(!Opaque && !(RenderFlags&LAYERRENDERFLAG_TRANSPARENT))
			continue;
		*/
		vec2 aTexCoords[4];
		for(int k = 0; k < 4; k++)
		{
			aTexCoords[k].x = fx2f(q->m_aTexcoords[k].x);
			aTexCoords[k].y = fx2f(q->m_aTexcoords[k].y);
		}

		// Check if we want to repeat the texture
		// Otherwise clamp to the edge to prevent texture bleeding
		bool RepeatU = false, RepeatV = false;
		for(int k = 0; k < 4; k++)
		{
			if(aTexCoords[k].x < 0.0f || aTexCoords[k].x > 1.0f)
				RepeatU = true;
			if(aTexCoords[k].y < 0.0f || aTexCoords[k].y > 1.0f)
				RepeatV = true;
		}
		Graphics()->WrapMode(
			RepeatU ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP,
			RepeatV ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP);

		Graphics()->QuadsSetSubsetFree(
			aTexCoords[0].x, aTexCoords[0].y,
			aTexCoords[1].x, aTexCoords[1].y,
			aTexCoords[2].x, aTexCoords[2].y,
			aTexCoords[3].x, aTexCoords[3].y);

		float OffsetX = 0;
		float OffsetY = 0;
		float Rot = 0;

		// TODO: fix this
		if(q->m_PosEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_PosEnvOffset/1000.0f, q->m_PosEnv, aChannels, pUser);
			OffsetX = aChannels[0];
			OffsetY = aChannels[1];
			Rot = aChannels[2]/360.0f*pi*2;
		}

		IGraphics::CColorVertex Array[4] = {
			IGraphics::CColorVertex(0, q->m_aColors[0].r*Conv*r*q->m_aColors[0].a*Conv*a, q->m_aColors[0].g*Conv*g*q->m_aColors[0].a*Conv*a, q->m_aColors[0].b*Conv*b*q->m_aColors[0].a*Conv*a, q->m_aColors[0].a*Conv*a),
			IGraphics::CColorVertex(1, q->m_aColors[1].r*Conv*r*q->m_aColors[1].a*Conv*a, q->m_aColors[1].g*Conv*g*q->m_aColors[1].a*Conv*a, q->m_aColors[1].b*Conv*b*q->m_aColors[1].a*Conv*a, q->m_aColors[1].a*Conv*a),
			IGraphics::CColorVertex(2, q->m_aColors[2].r*Conv*r*q->m_aColors[2].a*Conv*a, q->m_aColors[2].g*Conv*g*q->m_aColors[2].a*Conv*a, q->m_aColors[2].b*Conv*b*q->m_aColors[2].a*Conv*a, q->m_aColors[2].a*Conv*a),
			IGraphics::CColorVertex(3, q->m_aColors[3].r*Conv*r*q->m_aColors[3].a*Conv*a, q->m_aColors[3].g*Conv*g*q->m_aColors[3].a*Conv*a, q->m_aColors[3].b*Conv*b*q->m_aColors[3].a*Conv*a, q->m_aColors[3].a*Conv*a)};
		Graphics()->SetColorVertex(Array, 4);

		const CPoint *pPoints = q->m_aPoints;

		if(Rot != 0)
		{
			static CPoint aRotated[4];
			aRotated[0] = q->m_aPoints[0];
			aRotated[1] = q->m_aPoints[1];
			aRotated[2] = q->m_aPoints[2];
			aRotated[3] = q->m_aPoints[3];
			pPoints = aRotated;

			Rotate(&q->m_aPoints[4], &aRotated[0], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[1], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[2], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[3], Rot);
		}

		IGraphics::CFreeformItem Freeform(
			fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
			fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
			fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
			fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
		Graphics()->QuadsDrawFreeform(&Freeform, 1);
	}
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}